

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void print_sym(WINDOW *win,curses_symdef *sym,attr_t extra_attrs,wchar_t bg_color)

{
  attr_t aVar1;
  undefined1 local_40 [4];
  wchar_t color;
  cchar_t uni_out;
  attr_t attr;
  wchar_t bg_color_local;
  attr_t extra_attrs_local;
  curses_symdef *sym_local;
  WINDOW *win_local;
  
  uni_out.chars[4] = extra_attrs;
  uni_out.ext_color = bg_color;
  if (ui_flags.color != '\0') {
    aVar1 = curses_color_attr(sym->color & 0x1f,bg_color);
    uni_out.chars[4] = aVar1 | uni_out.chars[4];
    if ((sym->color & 0x20U) != 0) {
      uni_out.chars[4] = uni_out.chars[4] | 0x20000;
    }
  }
  if ((sym->unichar[0] == L'\0') || (ui_flags.unicode == '\0')) {
    wattr_on(win,uni_out.chars[4],0);
    waddch(win,(int)sym->ch);
    wattr_off(win,uni_out.chars[4],0);
  }
  else {
    setcchar(local_40,sym->unichar,uni_out.chars[4],(ushort)((uint)uni_out.chars[4] >> 8) & 0xff,0);
    wadd_wch(win,local_40);
  }
  return;
}

Assistant:

void print_sym(WINDOW *win, struct curses_symdef *sym,
	       attr_t extra_attrs, int bg_color)
{
    attr_t attr;
    cchar_t uni_out;

    /* in-game color index -> curses color */
    attr = A_NORMAL | extra_attrs;
    if (ui_flags.color) {
	attr |= curses_color_attr(sym->color & CLR_MASK, bg_color);
	if (sym->color & HI_ULINE) attr |= A_UNDERLINE;
    }

    /* print it; preferably as unicode */
    if (sym->unichar[0] && ui_flags.unicode) {
	int color = PAIR_NUMBER(attr);
	setcchar(&uni_out, sym->unichar, attr, color, NULL);
	wadd_wch(win, &uni_out);
    } else {
	wattron(win, attr);
	waddch(win, sym->ch);
	wattroff(win, attr);
    }
}